

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall
wasm::StubUnsupportedJSOpsPass::visitUnary(StubUnsupportedJSOpsPass *this,Unary *curr)

{
  Unary *curr_local;
  StubUnsupportedJSOpsPass *this_local;
  
  if (curr->op == ConvertUInt64ToFloat32) {
    stubOut(this,curr->value,
            (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.
                  id);
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    switch (curr->op) {
      case ConvertUInt64ToFloat32:
        // See detailed comment in lowerConvertIntToFloat in
        // I64ToI32Lowering.cpp.
        stubOut(curr->value, curr->type);
        break;
      default: {
      }
    }
  }